

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

rb_node * rb_next(rb_node *rbn)

{
  rb_node *prVar1;
  rb_node *prVar2;
  bool bVar3;
  
  prVar1 = rbn->right;
  if (rbn->right == (rb_node *)0x0) {
    prVar2 = rbn->parent;
    if ((prVar2 == (rb_node *)0x0) || (prVar2->left != rbn)) {
      do {
        prVar2 = rbn->parent;
        if (prVar2 == (rb_node *)0x0) {
          return (rb_node *)0x0;
        }
        bVar3 = rbn == prVar2->right;
        rbn = prVar2;
      } while (bVar3);
    }
  }
  else {
    do {
      prVar2 = prVar1;
      prVar1 = prVar2->left;
    } while (prVar2->left != (rb_node *)0x0);
  }
  return prVar2;
}

Assistant:

static struct rb_node *
rb_next(struct rb_node *rbn)
{
    if (RBN_RIGHT(rbn) != NULL) {
        rbn = RBN_RIGHT(rbn);
        while (RBN_LEFT(rbn) != NULL) {
            rbn = RBN_LEFT(rbn);
        }
    } else {
        if (RBN_PARENT(rbn) && (rbn == RBN_LEFT(RBN_PARENT(rbn)))) {
            rbn = RBN_PARENT(rbn);
        } else {
            while (RBN_PARENT(rbn) &&
                    (rbn == RBN_RIGHT(RBN_PARENT(rbn)))) {
                rbn = RBN_PARENT(rbn);
            }
            rbn = RBN_PARENT(rbn);
        }
    }

    return rbn;
}